

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDEdgeSharpness ON_SubDEdgeSharpness::Union(ON_SubDEdgeSharpness *a,ON_SubDEdgeSharpness *b)

{
  float fVar1;
  ON_SubDEdgeSharpness OVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_38 = 0;
  uStack_30 = 0;
  bVar3 = IsSharp(a);
  if (bVar3) {
    local_38 = *(undefined8 *)a->m_edge_sharpness;
    uVar5 = 2;
    local_28 = local_38;
  }
  else {
    uVar5 = 0;
    local_28 = 0;
  }
  uStack_20 = 0;
  bVar3 = IsSharp(b);
  if (bVar3) {
    *(undefined8 *)((long)&local_38 + uVar5 * 4) = *(undefined8 *)b->m_edge_sharpness;
    uVar5 = (ulong)((int)uVar5 + 2);
    fVar6 = (float)local_38;
  }
  else {
    fVar6 = (float)local_28;
  }
  OVar2 = FromConstant((double)fVar6);
  fVar8 = OVar2.m_edge_sharpness[1];
  fVar6 = OVar2.m_edge_sharpness[0];
  for (uVar4 = 1; uVar4 < uVar5; uVar4 = uVar4 + 1) {
    fVar1 = *(float *)((long)&local_38 + uVar4 * 4);
    fVar7 = fVar1;
    if ((fVar6 <= fVar1) && (fVar7 = fVar6, fVar8 < fVar1)) {
      fVar8 = fVar1;
    }
    fVar6 = fVar7;
  }
  OVar2.m_edge_sharpness[1] = fVar8;
  OVar2.m_edge_sharpness[0] = fVar6;
  return (ON_SubDEdgeSharpness)OVar2.m_edge_sharpness;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdgeSharpness::Union(
  const ON_SubDEdgeSharpness& a,
  const ON_SubDEdgeSharpness& b
)
{
  float s[4] = {};
  int count = 0;

  if (a.IsSharp())
  {
    s[0] = a.m_edge_sharpness[0];
    s[1] = a.m_edge_sharpness[1];
    count = 2;
  }
  if (b.IsSharp())
  {
    s[count] = b.m_edge_sharpness[0];
    s[count+1] = b.m_edge_sharpness[1];
    count += 2;
  }
  ON_SubDEdgeSharpness u = ON_SubDEdgeSharpness::FromConstant(s[0]);
  for ( int i = 1; i < count; ++i)
  { 
    float x = s[i];
    if (x < u.m_edge_sharpness[0])
      u.m_edge_sharpness[0] = x;
    else if (x > u.m_edge_sharpness[1])
      u.m_edge_sharpness[1] = x;
  }
  return u;
}